

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_LoadDocument(IXML_Document **retDoc,char *xmlFileName,int file)

{
  char **pstrSrc;
  byte bVar1;
  char cVar2;
  IXML_Attr *pIVar3;
  _IXML_NamespaceURI *p_Var4;
  IXML_Node *pIVar5;
  Nodeptr p_Var6;
  bool bVar7;
  ixml_membuf *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Parser *xmlParser;
  FILE *__stream;
  size_t sVar12;
  char *pcVar13;
  ptrdiff_t pVar14;
  IXML_Attr *pIVar15;
  IXML_ElementStack *pIVar16;
  IXML_Node **ppIVar17;
  int num;
  IXML_NamespaceURI *pIVar18;
  undefined8 uVar19;
  IXML_ElementStack *pCur;
  byte *pbVar20;
  byte *__src;
  bool bVar21;
  IXML_Document *gRootDoc;
  IXML_Node *tempNode;
  IXML_Node newNode;
  IXML_Attr *local_d8;
  IXML_Node *local_d0;
  ixml_membuf *local_c8;
  IXML_Node *local_c0;
  IXML_Node *local_b8;
  ixml_membuf *local_b0;
  IXML_Node local_a8;
  IXML_Document **local_38;
  
  xmlParser = (Parser *)malloc(0x78);
  if (xmlParser == (Parser *)0x0) {
    xmlParser = (Parser *)0x0;
  }
  else {
    xmlParser->pCurElement = (IXML_ElementStack *)0x0;
    xmlParser->currentNodePtr = (IXML_Node *)0x0;
    (xmlParser->tokenBuf).size_inc = 0;
    xmlParser->pNeedPrefixNode = (IXML_Node *)0x0;
    (xmlParser->tokenBuf).length = 0;
    (xmlParser->tokenBuf).capacity = 0;
    (xmlParser->lastElem).size_inc = 0;
    (xmlParser->tokenBuf).buf = (char *)0x0;
    (xmlParser->lastElem).length = 0;
    (xmlParser->lastElem).capacity = 0;
    xmlParser->savePtr = (char *)0x0;
    (xmlParser->lastElem).buf = (char *)0x0;
    xmlParser->dataBuffer = (char *)0x0;
    xmlParser->curPtr = (char *)0x0;
    xmlParser->state = eELEMENT;
    xmlParser->bHasTopLevel = 0;
    ixml_membuf_init(&xmlParser->tokenBuf);
    ixml_membuf_init(&xmlParser->lastElem);
  }
  if (xmlParser == (Parser *)0x0) {
    return 0x66;
  }
  local_38 = retDoc;
  if (file == 0) {
    pcVar13 = safe_strdup(xmlFileName);
    xmlParser->dataBuffer = pcVar13;
    if (pcVar13 == (char *)0x0) {
LAB_0012643d:
      iVar9 = 0x66;
      goto LAB_00126443;
    }
LAB_00126416:
    iVar9 = 0;
    bVar21 = true;
  }
  else {
    __stream = fopen(xmlFileName,"rb");
    if (__stream == (FILE *)0x0) {
      iVar9 = 0x65;
    }
    else {
      fseek(__stream,0,2);
      sVar12 = ftell(__stream);
      if (0 < (long)sVar12) {
        pcVar13 = (char *)malloc(sVar12 + 1);
        xmlParser->dataBuffer = pcVar13;
        if (pcVar13 == (char *)0x0) {
          fclose(__stream);
          goto LAB_0012643d;
        }
        fseek(__stream,0,0);
        sVar12 = fread(xmlParser->dataBuffer,1,sVar12,__stream);
        xmlParser->dataBuffer[sVar12] = '\0';
        fclose(__stream);
        goto LAB_00126416;
      }
      fclose(__stream);
      iVar9 = 0xc;
    }
LAB_00126443:
    bVar21 = false;
  }
  if (!bVar21) goto LAB_001265c3;
  xmlParser->curPtr = xmlParser->dataBuffer;
  local_d0 = (IXML_Node *)0x0;
  local_b8 = (IXML_Node *)0x0;
  local_c0 = (IXML_Node *)0x0;
  ixmlNode_init(&local_a8);
  iVar9 = ixmlDocument_createDocumentEx((IXML_Document **)&local_d0);
  if (iVar9 != 0) goto LAB_001265af;
  pstrSrc = &xmlParser->curPtr;
  xmlParser->currentNodePtr = local_d0;
  pcVar13 = xmlParser->curPtr;
  iVar9 = strncmp(pcVar13,anon_var_dwarf_3b260,3);
  if (iVar9 == 0) {
    *pstrSrc = pcVar13 + 3;
  }
  Parser_skipWhiteSpaces(xmlParser);
  pcVar13 = "<?xml ";
  iVar9 = strncmp(xmlParser->curPtr,"<?xml ",6);
  if (iVar9 == 0) {
    iVar9 = Parser_skipString(pstrSrc,pcVar13);
    Parser_skipWhiteSpaces(xmlParser);
    if (iVar9 == 0) goto LAB_001264e0;
  }
  else {
LAB_001264e0:
    iVar9 = Parser_skipMisc(xmlParser);
    if (iVar9 == 0) {
      pcVar13 = *pstrSrc;
      iVar10 = strncmp(pcVar13,"<!DOCTYPE",9);
      iVar9 = 0;
      if (iVar10 == 0) {
        pbVar20 = (byte *)(pcVar13 + 1);
        *pstrSrc = (char *)pbVar20;
        iVar10 = 1;
        iVar9 = 0xc;
        do {
          bVar1 = *pbVar20;
          if (bVar1 < 0x3c) {
            if (bVar1 == 0x22) {
              pbVar20 = (byte *)strchr((char *)(pbVar20 + 1),0x22);
              if (pbVar20 == (byte *)0x0) goto LAB_00126577;
            }
            else if (bVar1 == 0) goto LAB_00126577;
          }
          else if (bVar1 == 0x3e) {
            iVar10 = iVar10 + -1;
          }
          else if (bVar1 == 0x3c) {
            iVar10 = iVar10 + 1;
          }
          pbVar20 = pbVar20 + 1;
        } while (iVar10 != 0);
        *pstrSrc = (char *)pbVar20;
        iVar9 = 0;
      }
    }
LAB_00126577:
    if (iVar9 == 0) {
      iVar9 = Parser_skipMisc(xmlParser);
    }
  }
  if (iVar9 == 0) {
    local_c8 = &xmlParser->tokenBuf;
    local_b0 = &xmlParser->lastElem;
    do {
      ixmlNode_init(&local_a8);
      bVar21 = true;
      if (**pstrSrc == '\0') {
        iVar9 = 0x81a;
        uVar19 = 0x68;
      }
      else if (xmlParser->state == eCONTENT) {
        xmlParser->savePtr = *pstrSrc;
        Parser_skipWhiteSpaces(xmlParser);
        pIVar3 = (IXML_Attr *)xmlParser->curPtr;
        bVar1 = *(byte *)&(pIVar3->n).nodeName;
        bVar21 = true;
        iVar9 = 0;
        if (bVar1 == 0) {
LAB_0012669e:
          uVar19 = 0;
        }
        else {
          local_d8 = pIVar3;
          if (bVar1 != 0x3c) {
            pIVar3 = (IXML_Attr *)xmlParser->savePtr;
            xmlParser->curPtr = (char *)pIVar3;
            bVar1 = *(byte *)&(pIVar3->n).nodeName;
            pIVar15 = pIVar3;
            while (((bVar1 != 0x3c && (iVar9 = strncmp((char *)pIVar15,"]]>",3), bVar1 != 0)) &&
                   (iVar9 != 0))) {
              bVar1 = *(byte *)((long)&(pIVar15->n).nodeName + 1);
              pIVar15 = (IXML_Attr *)((long)&(pIVar15->n).nodeName + 1);
            }
            local_d8 = pIVar15;
            iVar9 = strncmp((char *)pIVar15,"]]>",3);
            piVar8 = local_c8;
            uVar19 = 0xc;
            if (iVar9 == 0) {
              iVar9 = 0x608;
            }
            else {
              ixml_membuf_destroy(local_c8);
              iVar9 = Parser_copyToken(xmlParser,xmlParser->curPtr,(long)pIVar15 - (long)pIVar3);
              if (iVar9 == 0) {
                if (piVar8->buf == (char *)0x0) {
                  iVar9 = 0x621;
                }
                else {
                  local_a8.nodeValue = strdup(piVar8->buf);
                  if (local_a8.nodeValue == (char *)0x0) {
                    uVar19 = 0x66;
                    iVar9 = 0x61c;
                  }
                  else {
                    local_a8.nodeName = strdup("#text");
                    if (local_a8.nodeName != (char *)0x0) {
                      local_a8.nodeType = eTEXT_NODE;
                      *pstrSrc = *pstrSrc + ((long)pIVar15 - (long)pIVar3);
                      goto LAB_00126bb7;
                    }
                    iVar9 = 0x628;
                  }
                }
              }
              else {
                iVar9 = 0x613;
              }
            }
            goto LAB_00126c0c;
          }
          iVar10 = strncmp((char *)pIVar3,"<![CDATA[",9);
          if (iVar10 == 0) {
            __src = (byte *)((long)&(pIVar3->n).nodeValue + 1);
            sVar12 = 0;
            pbVar20 = __src;
            while( true ) {
              bVar1 = *pbVar20;
              if ((bVar1 < 0xe) && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)) {
                bVar21 = false;
              }
              else {
                bVar21 = (int)(char)bVar1 - 0xd800U < 0xffff2820;
              }
              if ((bVar1 == 0 || bVar21) || (iVar9 = strncmp((char *)pbVar20,"]]>",3), iVar9 == 0))
              break;
              pbVar20 = pbVar20 + 1;
              sVar12 = sVar12 + 1;
            }
            if ((!bVar21) &&
               ((0 < (long)sVar12 && bVar1 != 0 &&
                (pcVar13 = (char *)malloc(sVar12 + 1), local_a8.nodeValue = pcVar13,
                pcVar13 != (char *)0x0)))) {
              strncpy(pcVar13,(char *)__src,sVar12);
              pcVar13[sVar12] = '\0';
              local_a8.nodeName = strdup("#cdata-section");
              if (local_a8.nodeName != (char *)0x0) {
                local_a8.nodeType = eCDATA_SECTION_NODE;
                local_d8 = (IXML_Attr *)(pbVar20 + 3);
                *pstrSrc = (char *)local_d8;
                iVar9 = 0;
                uVar19 = 0;
                bVar21 = true;
                goto LAB_00126c14;
              }
            }
            bVar21 = false;
            uVar19 = 0xc;
            iVar9 = 0x5da;
          }
          else {
            iVar10 = strncmp((char *)pIVar3,"<!--",4);
            if (iVar10 == 0) {
              iVar9 = Parser_skipComment((char **)&local_d8);
              if (iVar9 != 0) {
                uVar19 = 0xc;
                iVar9 = 0x5e4;
                goto LAB_00126c0c;
              }
              *pstrSrc = (char *)local_d8;
            }
            else {
              iVar10 = strncmp((char *)pIVar3,"<?",2);
              if (iVar10 != 0) {
                xmlParser->state = eELEMENT;
                goto LAB_0012669e;
              }
              iVar10 = strncasecmp((char *)pIVar3,"<?xml ",6);
              uVar19 = 0xc;
              iVar9 = 0x5ee;
              if ((iVar10 == 0) || (iVar10 = strncasecmp((char *)pIVar3,"<?xml?",6), iVar10 == 0)) {
LAB_00126c0c:
                bVar21 = false;
                goto LAB_00126c14;
              }
              iVar10 = strncasecmp((char *)pIVar3,"<?",2);
              if (iVar10 == 0) {
                pIVar15 = (IXML_Attr *)strstr((char *)pIVar3,"?>");
                if (pIVar15 == pIVar3 || pIVar15 == (IXML_Attr *)0x0) goto LAB_00126c0c;
                local_d8 = (IXML_Attr *)((long)&(pIVar15->n).nodeName + 2);
              }
              *pstrSrc = (char *)local_d8;
            }
LAB_00126bb7:
            iVar9 = 0;
            uVar19 = 0;
            bVar21 = true;
          }
        }
LAB_00126c14:
        if (!bVar21) {
          IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                     ,iVar9,"Parser_processContent","Error %d\n",uVar19);
        }
        iVar10 = 0x821;
LAB_00126c40:
        iVar9 = iVar10;
        bVar21 = false;
      }
      else {
        Parser_skipWhiteSpaces(xmlParser);
        pVar14 = Parser_getNextToken(xmlParser);
        if (((pVar14 == 0) && (xmlParser->pCurElement == (IXML_ElementStack *)0x0)) &&
           (**pstrSrc == '\0')) {
          iVar9 = 0x82a;
LAB_00126a53:
          bVar21 = false;
LAB_00126a55:
          uVar19 = 0;
        }
        else {
          uVar19 = 0xc;
          if ((xmlParser->tokenBuf).length == 0) {
            iVar10 = 0x82e;
            goto LAB_00126c40;
          }
          pcVar13 = local_c8->buf;
          cVar2 = *pcVar13;
          iVar9 = 0x835;
          if (cVar2 == '>') {
            bVar21 = false;
            uVar19 = 0;
          }
          else {
            iVar9 = strcmp(pcVar13,"</");
            if (iVar9 != 0) {
              if (cVar2 == '<') {
                pVar14 = Parser_getNextToken(xmlParser);
                piVar8 = local_c8;
                iVar11 = 0x83e;
                iVar10 = 0x83e;
                iVar9 = 0x83e;
                if ((pVar14 != 0) && (local_c8->buf != (char *)0x0)) {
                  local_a8.nodeName = strdup(local_c8->buf);
                  if (local_a8.nodeName == (char *)0x0) {
LAB_00126f5d:
                    uVar19 = 0x66;
                    iVar10 = iVar11;
                  }
                  else {
                    iVar11 = ixml_membuf_assign_str(local_b0,local_a8.nodeName);
                    if ((iVar11 != 0) ||
                       (iVar11 = Parser_setNodePrefixAndLocalName(&local_a8), iVar11 != 0)) {
                      bVar21 = false;
                      uVar19 = 0x6a;
                      goto LAB_00126c42;
                    }
                    local_a8.nodeValue = (char *)0x0;
                    local_a8.nodeType = eELEMENT_NODE;
                    xmlParser->savePtr = xmlParser->curPtr;
                    pVar14 = Parser_getNextToken(xmlParser);
                    if (pVar14 != 0) {
                      pcVar13 = piVar8->buf;
                      iVar10 = strcmp(pcVar13,"/>");
                      iVar9 = 0x83e;
                      if (iVar10 == 0) {
                        xmlParser->state = eELEMENT;
                      }
                      else {
                        iVar10 = strcmp(pcVar13,">");
                        if (iVar10 == 0) {
                          xmlParser->state = eCONTENT;
                          goto LAB_00126a53;
                        }
                        xmlParser->state = eATTRIBUTE;
                      }
                      xmlParser->curPtr = xmlParser->savePtr;
                      goto LAB_00126a53;
                    }
                  }
                }
              }
              else {
                iVar9 = strcmp(pcVar13,"/>");
                if (iVar9 == 0) {
                  if (local_b0->buf != (char *)0x0) {
                    local_a8.nodeName = strdup(local_b0->buf);
                    if (local_a8.nodeName != (char *)0x0) {
                      local_a8.nodeType = eELEMENT_NODE;
                      iVar9 = 0x852;
                      bVar21 = true;
                      goto LAB_00126a55;
                    }
                    iVar11 = 0x84b;
                    goto LAB_00126f5d;
                  }
                  iVar10 = 0x844;
                }
                else if (xmlParser->pCurElement == (IXML_ElementStack *)0x0) {
                  iVar10 = 0x865;
                }
                else {
                  iVar10 = 0x860;
                  if (xmlParser->state == eATTRIBUTE) {
                    iVar10 = Parser_processAttribute(xmlParser,&local_a8);
                    uVar19 = 0xc;
                    if (iVar10 == 0) {
                      uVar19 = 0;
                    }
                    if (iVar10 != 0) {
                      iVar10 = 0x85a;
                    }
                  }
                }
              }
              goto LAB_00126c40;
            }
            pVar14 = Parser_getNextToken(xmlParser);
            piVar8 = local_c8;
            uVar19 = 0xc;
            if (pVar14 == 0) {
              iVar10 = 0x64f;
              bVar21 = false;
              bVar7 = false;
            }
            else {
              if (local_c8->buf == (char *)0x0) {
                iVar10 = 0x656;
              }
              else {
                local_a8.nodeName = strdup(local_c8->buf);
                if (local_a8.nodeName == (char *)0x0) {
                  iVar10 = 0x65c;
                  uVar19 = 0x66;
                }
                else {
                  local_a8.nodeValue = (char *)0x0;
                  local_a8.nodeType = eELEMENT_NODE;
                  Parser_skipWhiteSpaces(xmlParser);
                  pVar14 = Parser_getNextToken(xmlParser);
                  if (pVar14 == 0) {
                    iVar10 = 0x668;
                  }
                  else if (piVar8->buf == (char *)0x0) {
                    iVar10 = 0x670;
                  }
                  else {
                    iVar9 = strcmp(piVar8->buf,">");
                    if (iVar9 == 0) {
                      uVar19 = 0;
                      bVar7 = true;
                      bVar21 = true;
                      iVar10 = 0;
                      goto LAB_00126f8f;
                    }
                    iVar10 = 0x676;
                  }
                }
              }
              bVar21 = false;
              bVar7 = false;
            }
LAB_00126f8f:
            iVar9 = 0x83a;
            if (!bVar7) {
              IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                         ,iVar10,"Parser_processETag","Error %d\n",uVar19);
            }
          }
        }
      }
LAB_00126c42:
      pcVar13 = local_a8.nodeName;
      pIVar5 = local_d0;
      if ((int)uVar19 != 0) {
        if ((int)uVar19 != 0x68) {
          IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                     ,iVar9,"Parser_getNextNode","Error %d\n",uVar19);
        }
        if (!bVar21) {
          iVar9 = 0x6a;
          break;
        }
        iVar9 = 0xc;
        if (xmlParser->pCurElement != (IXML_ElementStack *)0x0) break;
        *local_38 = (IXML_Document *)local_d0;
        iVar9 = 0;
        goto LAB_001265c3;
      }
      if (bVar21) {
        if (local_a8.nodeName == (char *)0x0) {
          __assert_fail("newNode->nodeName",
                        "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                        ,0x9e8,"int Parser_eTagVerification(Parser *, IXML_Node *)");
        }
        if (xmlParser->currentNodePtr == (IXML_Node *)0x0) {
          __assert_fail("xmlParser->currentNodePtr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                        ,0x9e9,"int Parser_eTagVerification(Parser *, IXML_Node *)");
        }
        if (local_a8.nodeType == eELEMENT_NODE) {
          pIVar16 = xmlParser->pCurElement;
          if (pIVar16 != (IXML_ElementStack *)0x0) {
            if (pIVar16->element == (char *)0x0) {
              __assert_fail("xmlParser->pCurElement->element",
                            "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                            ,0x9bf,"int Parser_isValidEndElement(Parser *, IXML_Node *)");
            }
            iVar9 = strcmp(pIVar16->element,local_a8.nodeName);
            if (iVar9 == 0) {
              xmlParser->pCurElement = pIVar16->nextElement;
              Parser_freeElementStackItem(pIVar16);
              pIVar18 = pIVar16->pNsURI;
              while (pIVar18 != (IXML_NamespaceURI *)0x0) {
                p_Var4 = pIVar18->nextNsURI;
                Parser_freeNsURI(pIVar18);
                free(pIVar18);
                pIVar18 = p_Var4;
              }
              free(pIVar16);
              goto LAB_00126cde;
            }
          }
LAB_00126cfc:
          iVar9 = 0xc;
          bVar21 = false;
        }
        else {
LAB_00126cde:
          pIVar5 = xmlParser->currentNodePtr;
          iVar10 = strcmp(local_a8.nodeName,pIVar5->nodeName);
          iVar9 = 0;
          if (iVar10 != 0) goto LAB_00126cfc;
          xmlParser->currentNodePtr = pIVar5->parentNode;
          bVar21 = true;
        }
        if (bVar21) {
          xmlParser->state = eCONTENT;
          goto switchD_00126d1e_default;
        }
        break;
      }
      switch(local_a8.nodeType) {
      case eELEMENT_NODE:
        local_d8 = (IXML_Attr *)0x0;
        if (xmlParser->bHasTopLevel == 0) {
          xmlParser->bHasTopLevel = 1;
        }
        else if (xmlParser->pCurElement == (IXML_ElementStack *)0x0) {
          iVar9 = 0xc;
          goto joined_r0x00126ec6;
        }
        xmlParser->savePtr = xmlParser->curPtr;
        iVar9 = ixmlDocument_createElementEx
                          ((IXML_Document *)local_d0,local_a8.nodeName,(IXML_Element **)&local_d8);
        if (iVar9 == 0) {
          iVar9 = ixmlNode_setNodeProperties(&local_d8->n,&local_a8);
          pcVar13 = local_a8.prefix;
          if (iVar9 == 0) {
            pIVar16 = xmlParser->pCurElement;
            if (local_a8.prefix == (char *)0x0) {
              bVar21 = true;
              for (; pIVar16 != (IXML_ElementStack *)0x0; pIVar16 = pIVar16->nextElement) {
                if ((pIVar16->prefix == (char *)0x0) &&
                   (pcVar13 = pIVar16->namespaceUri, pcVar13 != (char *)0x0)) {
                  bVar21 = false;
                  goto LAB_00126f6a;
                }
              }
              pcVar13 = (char *)0x0;
LAB_00126f6a:
              if (bVar21) {
                if (xmlParser->state == eATTRIBUTE) {
                  xmlParser->pNeedPrefixNode = &local_d8->n;
                }
              }
              else if (local_d8 != (IXML_Attr *)0x0 && pcVar13 != (char *)0x0) goto LAB_001270a6;
            }
            else {
              bVar21 = true;
              for (; pIVar16 != (IXML_ElementStack *)0x0; pIVar16 = pIVar16->nextElement) {
                if ((pIVar16->prefix != (char *)0x0) &&
                   (iVar9 = strcmp(pIVar16->prefix,pcVar13), iVar9 == 0)) {
                  pIVar18 = (IXML_NamespaceURI *)&pIVar16->namespaceUri;
LAB_00127076:
                  pcVar13 = pIVar18->nsURI;
                  bVar21 = false;
                  goto LAB_0012707c;
                }
                for (pIVar18 = pIVar16->pNsURI; pIVar18 != (IXML_NamespaceURI *)0x0;
                    pIVar18 = pIVar18->nextNsURI) {
                  iVar9 = strcmp(pIVar18->prefix,pcVar13);
                  if (iVar9 == 0) goto LAB_00127076;
                }
              }
              pcVar13 = (char *)0x0;
LAB_0012707c:
              if (bVar21) {
                xmlParser->pNeedPrefixNode = &local_d8->n;
              }
              else if (local_d8 != (IXML_Attr *)0x0 && pcVar13 != (char *)0x0) {
LAB_001270a6:
                pIVar3 = local_d8;
                if ((local_d8->n).namespaceURI == (char *)0x0) {
                  pcVar13 = strdup(pcVar13);
                  (pIVar3->n).namespaceURI = pcVar13;
                }
              }
            }
            iVar9 = ixmlNode_appendChild(xmlParser->currentNodePtr,&local_d8->n);
            pIVar3 = local_d8;
            if (iVar9 == 0) {
              xmlParser->currentNodePtr = &local_d8->n;
              if (local_d8 == (IXML_Attr *)0x0) {
                __assert_fail("newElement",
                              "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                              ,0x90a,"int Parser_pushElement(Parser *, IXML_Node *)");
              }
              pIVar16 = (IXML_ElementStack *)malloc(0x28);
              iVar9 = 0x66;
              if (pIVar16 != (IXML_ElementStack *)0x0) {
                pIVar16->namespaceUri = (char *)0x0;
                pIVar16->pNsURI = (IXML_NamespaceURI *)0x0;
                pIVar16->element = (char *)0x0;
                pIVar16->prefix = (char *)0x0;
                pIVar16->nextElement = (_IXML_ElementStack *)0x0;
                pcVar13 = safe_strdup((pIVar3->n).nodeName);
                pIVar16->element = pcVar13;
                if (pcVar13 != (char *)0x0) {
                  pcVar13 = (pIVar3->n).prefix;
                  if (pcVar13 == (char *)0x0) {
LAB_00127149:
                    pcVar13 = (pIVar3->n).namespaceURI;
                    if (pcVar13 != (char *)0x0) {
                      pcVar13 = strdup(pcVar13);
                      pIVar16->namespaceUri = pcVar13;
                      if (pcVar13 == (char *)0x0) goto LAB_00127174;
                    }
                    pIVar16->nextElement = xmlParser->pCurElement;
                    xmlParser->pCurElement = pIVar16;
                    iVar9 = 0;
                    goto joined_r0x00126ec6;
                  }
                  pcVar13 = strdup(pcVar13);
                  pIVar16->prefix = pcVar13;
                  if (pcVar13 != (char *)0x0) goto LAB_00127149;
LAB_00127174:
                  Parser_freeElementStackItem(pIVar16);
                }
                free(pIVar16);
              }
            }
            else {
              ixmlElement_free((IXML_Element *)local_d8);
            }
          }
          else {
            ixmlElement_free((IXML_Element *)local_d8);
          }
        }
        goto joined_r0x00126ec6;
      case eATTRIBUTE_NODE:
        local_d8 = (IXML_Attr *)0x0;
        for (p_Var6 = xmlParser->currentNodePtr->firstAttr; p_Var6 != (Nodeptr)0x0;
            p_Var6 = p_Var6->nextSibling) {
          iVar9 = strcmp(p_Var6->nodeName,pcVar13);
          if (iVar9 == 0) {
            iVar9 = 0xc;
            goto joined_r0x00126ec6;
          }
        }
        iVar9 = ixmlDocument_createAttributeEx((IXML_Document *)pIVar5,local_a8.nodeName,&local_d8);
        if ((iVar9 == 0) &&
           ((iVar9 = ixmlNode_setNodeProperties(&local_d8->n,&local_a8), iVar9 != 0 ||
            (iVar9 = ixmlElement_setAttributeNode
                               ((IXML_Element *)xmlParser->currentNodePtr,local_d8,(IXML_Attr **)0x0
                               ), iVar9 != 0)))) {
          ixmlAttr_free(local_d8);
        }
joined_r0x00126ec6:
        if (iVar9 != 0) goto LAB_001265af;
        break;
      case eTEXT_NODE:
        iVar9 = ixmlDocument_createTextNodeEx
                          ((IXML_Document *)local_d0,local_a8.nodeValue,&local_b8);
        if (iVar9 != 0) goto LAB_001265af;
        iVar9 = ixmlNode_appendChild(xmlParser->currentNodePtr,local_b8);
        if (iVar9 != 0) {
          ppIVar17 = &local_b8;
          goto LAB_00127207;
        }
        break;
      case eCDATA_SECTION_NODE:
        iVar9 = ixmlDocument_createCDATASectionEx
                          ((IXML_Document *)local_d0,local_a8.nodeValue,
                           (IXML_CDATASection **)&local_c0);
        if (iVar9 != 0) goto LAB_001265af;
        iVar9 = ixmlNode_appendChild(xmlParser->currentNodePtr,local_c0);
        if (iVar9 != 0) goto LAB_001271f5;
      }
switchD_00126d1e_default:
      Parser_freeNodeContent(&local_a8);
    } while( true );
  }
  goto LAB_001265af;
LAB_001271f5:
  ppIVar17 = &local_c0;
LAB_00127207:
  ixmlNode_free(*ppIVar17);
LAB_001265af:
  Parser_freeNodeContent(&local_a8);
  ixmlDocument_free((IXML_Document *)local_d0);
LAB_001265c3:
  Parser_free(xmlParser);
  return iVar9;
}

Assistant:

int Parser_LoadDocument(
	/*! [out] The output document tree. */
	IXML_Document **retDoc,
	/*! [in] The file name or the buffer to copy, according to the
	 * parameter "file". */
	const char *xmlFileName,
	/*! [in] 1 if you want to read from a file, 0 if xmlFileName is
	 * the buffer to copy to the parser. */
	int file)
{
	int rc = IXML_SUCCESS;
	Parser *xmlParser = NULL;

	xmlParser = Parser_init();
	if (xmlParser == NULL) {
		return IXML_INSUFFICIENT_MEMORY;
	}

	rc = Parser_readFileOrBuffer(xmlParser, xmlFileName, file);
	if (rc != IXML_SUCCESS) {
		Parser_free(xmlParser);
		return rc;
	}

	xmlParser->curPtr = xmlParser->dataBuffer;
	rc = Parser_parseDocument(retDoc, xmlParser);
	return rc;
}